

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O3

VkResult __thiscall
VmaAllocator_T::CreatePool(VmaAllocator_T *this,VmaPoolCreateInfo *pCreateInfo,VmaPool *pPool)

{
  bool bVar1;
  uint32_t uVar2;
  ulong uVar3;
  PFN_vkAllocationFunction p_Var4;
  VmaPool pVVar5;
  VkResult VVar6;
  int iVar7;
  VmaPool_T *pVVar8;
  size_t sVar9;
  VkDeviceSize VVar10;
  VmaPoolCreateInfo newCreateInfo;
  VmaPoolCreateInfo local_68;
  
  local_68.memoryTypeIndex = pCreateInfo->memoryTypeIndex;
  local_68.flags = pCreateInfo->flags;
  local_68.blockSize._0_4_ = (undefined4)pCreateInfo->blockSize;
  local_68.blockSize._4_4_ = *(undefined4 *)((long)&pCreateInfo->blockSize + 4);
  local_68.minBlockCount._0_4_ = (undefined4)pCreateInfo->minBlockCount;
  local_68.minBlockCount._4_4_ = *(undefined4 *)((long)&pCreateInfo->minBlockCount + 4);
  local_68.priority = pCreateInfo->priority;
  local_68._36_4_ = *(undefined4 *)&pCreateInfo->field_0x24;
  local_68.minAllocationAlignment._0_4_ = (undefined4)pCreateInfo->minAllocationAlignment;
  local_68.minAllocationAlignment._4_4_ =
       *(undefined4 *)((long)&pCreateInfo->minAllocationAlignment + 4);
  local_68.pMemoryAllocateNext = pCreateInfo->pMemoryAllocateNext;
  local_68.maxBlockCount = -(ulong)(pCreateInfo->maxBlockCount == 0) | pCreateInfo->maxBlockCount;
  VVar6 = VK_ERROR_INITIALIZATION_FAILED;
  if (pCreateInfo->minBlockCount <= local_68.maxBlockCount) {
    VVar6 = VK_ERROR_FEATURE_NOT_PRESENT;
    if ((pCreateInfo->memoryTypeIndex < (this->m_MemProps).memoryTypeCount) &&
       ((this->m_GlobalMemoryTypeBits >> (pCreateInfo->memoryTypeIndex & 0x1f) & 1) != 0)) {
      uVar3 = (this->m_MemProps).memoryHeaps
              [(this->m_MemProps).memoryTypes[local_68.memoryTypeIndex].heapIndex].size;
      if (uVar3 < 0x40000001) {
        VVar10 = uVar3 >> 3;
      }
      else {
        VVar10 = this->m_PreferredLargeHeapBlockSize;
      }
      p_Var4 = (this->m_AllocationCallbacks).pfnAllocation;
      if (p_Var4 == (PFN_vkAllocationFunction)0x0) {
        pVVar8 = (VmaPool_T *)aligned_alloc(8,0x130);
      }
      else {
        pVVar8 = (VmaPool_T *)
                 (*p_Var4)((this->m_AllocationCallbacks).pUserData,0x130,8,
                           VK_SYSTEM_ALLOCATION_SCOPE_OBJECT);
      }
      VmaPool_T::VmaPool_T(pVVar8,this,&local_68,VVar10 + 0x1f & 0xffffffffffffffe0);
      *pPool = pVVar8;
      VVar6 = VmaBlockVector::CreateMinBlocks(&pVVar8->m_BlockVector);
      if (VVar6 == VK_SUCCESS) {
        bVar1 = this->m_UseMutex;
        if (bVar1 == true) {
          iVar7 = pthread_rwlock_wrlock((pthread_rwlock_t *)&this->m_PoolsMutex);
          if (iVar7 == 0x23) {
            std::__throw_system_error(0x23);
          }
        }
        pVVar5 = *pPool;
        uVar2 = this->m_NextPoolId;
        this->m_NextPoolId = uVar2 + 1;
        pVVar5->m_Id = uVar2;
        sVar9 = (this->m_Pools).m_Count;
        if (sVar9 == 0) {
          (this->m_Pools).m_Front = pVVar5;
          (this->m_Pools).m_Back = pVVar5;
          sVar9 = 1;
        }
        else {
          pVVar8 = (this->m_Pools).m_Back;
          pVVar5->m_PrevPool = pVVar8;
          pVVar8->m_NextPool = pVVar5;
          (this->m_Pools).m_Back = pVVar5;
          sVar9 = sVar9 + 1;
        }
        (this->m_Pools).m_Count = sVar9;
        VVar6 = VK_SUCCESS;
        if (bVar1 != false) {
          pthread_rwlock_unlock((pthread_rwlock_t *)&this->m_PoolsMutex);
        }
      }
      else {
        vma_delete<VmaPool_T>(this,*pPool);
        *pPool = (VmaPool)0x0;
      }
    }
  }
  return VVar6;
}

Assistant:

VkResult VmaAllocator_T::CreatePool(const VmaPoolCreateInfo* pCreateInfo, VmaPool* pPool)
{
    VMA_DEBUG_LOG("  CreatePool: MemoryTypeIndex=%u, flags=%u", pCreateInfo->memoryTypeIndex, pCreateInfo->flags);

    VmaPoolCreateInfo newCreateInfo = *pCreateInfo;

    // Protection against uninitialized new structure member. If garbage data are left there, this pointer dereference would crash.
    if(pCreateInfo->pMemoryAllocateNext)
    {
        VMA_ASSERT(((const VkBaseInStructure*)pCreateInfo->pMemoryAllocateNext)->sType != 0);
    }

    if(newCreateInfo.maxBlockCount == 0)
    {
        newCreateInfo.maxBlockCount = SIZE_MAX;
    }
    if(newCreateInfo.minBlockCount > newCreateInfo.maxBlockCount)
    {
        return VK_ERROR_INITIALIZATION_FAILED;
    }
    // Memory type index out of range or forbidden.
    if(pCreateInfo->memoryTypeIndex >= GetMemoryTypeCount() ||
        ((1u << pCreateInfo->memoryTypeIndex) & m_GlobalMemoryTypeBits) == 0)
    {
        return VK_ERROR_FEATURE_NOT_PRESENT;
    }
    if(newCreateInfo.minAllocationAlignment > 0)
    {
        VMA_ASSERT(VmaIsPow2(newCreateInfo.minAllocationAlignment));
    }

    const VkDeviceSize preferredBlockSize = CalcPreferredBlockSize(newCreateInfo.memoryTypeIndex);

    *pPool = vma_new(this, VmaPool_T)(this, newCreateInfo, preferredBlockSize);

    VkResult res = (*pPool)->m_BlockVector.CreateMinBlocks();
    if(res != VK_SUCCESS)
    {
        vma_delete(this, *pPool);
        *pPool = VMA_NULL;
        return res;
    }

    // Add to m_Pools.
    {
        VmaMutexLockWrite lock(m_PoolsMutex, m_UseMutex);
        (*pPool)->SetId(m_NextPoolId++);
        m_Pools.PushBack(*pPool);
    }

    return VK_SUCCESS;
}